

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

string * units::shortStringReplacement_abi_cxx11_(char U)

{
  int iVar1;
  const_iterator cVar2;
  string *extraout_RAX;
  string *psVar3;
  long lVar4;
  byte in_SIL;
  long *in_RDI;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  byte local_596;
  undefined1 local_595;
  undefined1 local_594;
  undefined1 local_593;
  char local_592 [34];
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_570;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_548;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_520;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4f8;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4d0;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4a8;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_480;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_458;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_430;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_408;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3e0;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b8;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_390;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_368;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_340;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_318;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2f0;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2c8;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a0;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_228;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_200;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  
  local_596 = in_SIL;
  if (shortStringReplacement[abi:cxx11](char)::singleCharUnitStrings_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&shortStringReplacement[abi:cxx11](char)::
                                 singleCharUnitStrings_abi_cxx11_);
    if (iVar1 != 0) {
      local_592[0x21] = 0x6d;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[6],_true>(&local_570,local_592 + 0x21,(char (*) [6])0x435199);
      local_592[0x20] = 0x73;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[7],_true>(&local_548,local_592 + 0x20,(char (*) [7])0x431613);
      local_592[0x1f] = 0x53;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[8],_true>(&local_520,local_592 + 0x1f,(char (*) [8])"siemens");
      local_592[0x1e] = 0x6c;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[6],_true>(&local_4f8,local_592 + 0x1e,(char (*) [6])0x4309c4);
      local_592[0x1d] = 0x67;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[5],_true>(&local_4d0,local_592 + 0x1d,(char (*) [5])0x4321d9);
      local_592[0x1c] = 0x62;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[5],_true>(&local_4a8,local_592 + 0x1c,(char (*) [5])"barn");
      local_592[0x1b] = 0x72;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[12],_true>
                (&local_480,local_592 + 0x1b,(char (*) [12])"revolutions");
      local_592[0x1a] = 0x56;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[5],_true>(&local_458,local_592 + 0x1a,(char (*) [5])0x432552);
      local_592[0x19] = 0x46;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[6],_true>(&local_430,local_592 + 0x19,(char (*) [6])0x4311be);
      local_592[0x18] = 0x79;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[5],_true>(&local_408,local_592 + 0x18,(char (*) [5])0x41f2f5);
      local_592[0x17] = 0x70;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[6],_true>(&local_3e0,local_592 + 0x17,(char (*) [6])"poise");
      local_592[0x16] = 0x4b;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[7],_true>(&local_3b8,local_592 + 0x16,(char (*) [7])0x431130);
      local_592[0x15] = 0x61;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[4],_true>(&local_390,local_592 + 0x15,(char (*) [4])0x431d1f);
      local_592[0x14] = 0x4e;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[7],_true>(&local_368,local_592 + 0x14,(char (*) [7])"newton");
      local_592[0x13] = 100;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[4],_true>(&local_340,local_592 + 0x13,(char (*) [4])0x430806);
      local_592[0x12] = 0x42;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[5],_true>(&local_318,local_592 + 0x12,(char (*) [5])0x429d9b);
      local_592[0x11] = 0x58;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[3],_true>(&local_2f0,local_592 + 0x11,(char (*) [3])"xu");
      local_592[0x10] = 0x54;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[6],_true>(&local_2c8,local_592 + 0x10,(char (*) [6])"tesla");
      local_592[0xf] = 0x55;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[6],_true>(&local_2a0,local_592 + 0xf,(char (*) [6])0x40a69f);
      local_592[0xe] = 0x4d;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[6],_true>(&local_278,local_592 + 0xe,(char (*) [6])"molar");
      local_592[0xd] = 0x50;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[6],_true>(&local_250,local_592 + 0xd,(char (*) [6])"poise");
      local_592[0xc] = 0x57;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[5],_true>(&local_228,local_592 + 0xc,(char (*) [5])0x431d42);
      local_592[0xb] = 0x41;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[7],_true>(&local_200,local_592 + 0xb,(char (*) [7])"ampere");
      local_592[10] = 0x43;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[8],_true>(&local_1d8,local_592 + 10,(char (*) [8])0x431b8d);
      local_592[9] = 0x4a;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[6],_true>(&local_1b0,local_592 + 9,(char (*) [6])"joule");
      local_592[8] = 0x48;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[6],_true>(&local_188,local_592 + 8,(char (*) [6])0x431252);
      local_592[7] = 0x47;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[6],_true>(&local_160,local_592 + 7,(char (*) [6])"gauss");
      local_592[6] = 0x68;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[5],_true>(&local_138,local_592 + 6,(char (*) [5])0x433d0c);
      local_592[5] = 0x44;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[4],_true>(&local_110,local_592 + 5,(char (*) [4])0x430806);
      local_592[4] = 0x6f;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[7],_true>(&local_e8,local_592 + 4,(char (*) [7])"arcdeg");
      local_592[3] = 0x4c;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[7],_true>(&local_c0,local_592 + 3,(char (*) [7])"liter ");
      local_592[2] = 0x57;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[5],_true>(&local_98,local_592 + 2,(char (*) [5])0x431d42);
      local_592[1] = 0x65;
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[17],_true>
                (&local_70,local_592 + 1,(char (*) [17])"elementarycharge");
      local_592[0] = 't';
      std::
      pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<char,_const_char_(&)[6],_true>(&local_48,local_592,(char (*) [6])0x433c1a);
      std::
      _Hashtable<char,std::pair<char_const,std::__cxx11::string>,std::allocator<std::pair<char_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_Hashtable<std::pair<char_const,std::__cxx11::string>const*>
                ((_Hashtable<char,std::pair<char_const,std::__cxx11::string>,std::allocator<std::pair<char_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&shortStringReplacement[abi:cxx11](char)::singleCharUnitStrings_abi_cxx11_,
                 &local_570,&stack0xffffffffffffffe0,0,&local_593,&local_594,&local_595);
      lVar4 = -0x550;
      paVar5 = &local_48.second.field_2;
      do {
        if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar5->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar5->_M_allocated_capacity)[-2],
                          paVar5->_M_allocated_capacity + 1);
        }
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar5->_M_allocated_capacity + -5);
        lVar4 = lVar4 + 0x28;
      } while (lVar4 != 0);
      __cxa_atexit(std::
                   unordered_map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~unordered_map,
                   &shortStringReplacement[abi:cxx11](char)::singleCharUnitStrings_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&shortStringReplacement[abi:cxx11](char)::singleCharUnitStrings_abi_cxx11_
                         );
    }
  }
  cVar2 = std::
          _Hashtable<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&shortStringReplacement[abi:cxx11](char)::singleCharUnitStrings_abi_cxx11_._M_h,
                 (key_type_conflict1 *)&local_596);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    psVar3 = (string *)(ulong)local_596;
    *in_RDI = (long)(in_RDI + 2);
    *(byte *)(in_RDI + 2) = local_596;
    in_RDI[1] = 1;
    *(undefined1 *)((long)in_RDI + 0x11) = 0;
  }
  else {
    *in_RDI = (long)(in_RDI + 2);
    std::__cxx11::string::_M_construct<char*>();
    psVar3 = extraout_RAX;
  }
  return psVar3;
}

Assistant:

static std::string shortStringReplacement(char U)
{
    // LCOV_EXCL_START
    // not sure why this isn't showing up as covered
    static const std::unordered_map<char, std::string> singleCharUnitStrings{
        {'m', "meter"},       {'s', "second"}, {'S', "siemens"},
        {'l', "liter"},       {'g', "gram"},   {'b', "barn"},
        {'r', "revolutions"}, {'V', "volt"},   {'F', "farad"},
        {'y', "year"},        {'p', "poise"},  {'K', "kelvin"},
        {'a', "are"},         {'N', "newton"}, {'d', "day"},
        {'B', "byte"},        {'X', "xu"},     {'T', "tesla"},
        {'U', "units"},       {'M', "molar"},  {'P', "poise"},
        {'W', "watt"},        {'A', "ampere"}, {'C', "coulomb"},
        {'J', "joule"},       {'H', "henry"},  {'G', "gauss"},
        {'h', "hour"},        {'D', "day"},    {'o', "arcdeg"},
        {'L', "liter "},      {'W', "watt"},   {'e', "elementarycharge"},
        {'t', "tonne"}};

    // LCOV_EXCL_STOP

    auto res = singleCharUnitStrings.find(U);
    return (res == singleCharUnitStrings.end()) ? std::string(1, U) :
                                                  res->second;
}